

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturemanager.cpp
# Opt level: O2

void __thiscall FTextureManager::DeleteAll(FTextureManager *this)

{
  TArray<FAnimDef_*,_FAnimDef_*> *this_00;
  TArray<FSwitchDef_*,_FSwitchDef_*> *this_01;
  TArray<FDoorAnimation,_FDoorAnimation> *this_02;
  long *plVar1;
  void *pvVar2;
  uchar *puVar3;
  uint i_3;
  long lVar4;
  uint i;
  ulong uVar5;
  
  lVar4 = 0;
  for (uVar5 = 0; uVar5 < (this->Textures).Count; uVar5 = uVar5 + 1) {
    plVar1 = *(long **)((long)&((this->Textures).Array)->Texture + lVar4);
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
    lVar4 = lVar4 + 0x10;
  }
  TArray<FTextureManager::TextureHash,_FTextureManager::TextureHash>::Clear(&this->Textures);
  TArray<int,_int>::Clear(&this->Translation);
  TArray<int,_int>::Clear(&this->FirstTextureForFile);
  this_00 = &this->mAnimations;
  memset(this->HashFirst,0xff,0x1010);
  for (uVar5 = 0; uVar5 < (this->mAnimations).Count; uVar5 = uVar5 + 1) {
    if (this_00->Array[uVar5] != (FAnimDef *)0x0) {
      M_Free(this_00->Array[uVar5]);
      this_00->Array[uVar5] = (FAnimDef *)0x0;
    }
  }
  TArray<FAnimDef_*,_FAnimDef_*>::Clear(this_00);
  this_01 = &this->mSwitchDefs;
  for (uVar5 = 0; uVar5 < (this->mSwitchDefs).Count; uVar5 = uVar5 + 1) {
    if (this_01->Array[uVar5] != (FSwitchDef *)0x0) {
      M_Free(this_01->Array[uVar5]);
      this_01->Array[uVar5] = (FSwitchDef *)0x0;
    }
  }
  TArray<FSwitchDef_*,_FSwitchDef_*>::Clear(this_01);
  this_02 = &this->mAnimatedDoors;
  lVar4 = 8;
  for (uVar5 = 0; uVar5 < (this->mAnimatedDoors).Count; uVar5 = uVar5 + 1) {
    pvVar2 = *(void **)((long)&(this_02->Array->BaseTexture).texnum + lVar4);
    if (pvVar2 != (void *)0x0) {
      operator_delete__(pvVar2);
      *(undefined8 *)((long)&(this_02->Array->BaseTexture).texnum + lVar4) = 0;
    }
    lVar4 = lVar4 + 0x20;
  }
  TArray<FDoorAnimation,_FDoorAnimation>::Clear(this_02);
  for (uVar5 = 0; uVar5 < (this->BuildTileFiles).Count; uVar5 = uVar5 + 1) {
    puVar3 = (this->BuildTileFiles).Array[uVar5];
    if (puVar3 != (uchar *)0x0) {
      operator_delete__(puVar3);
    }
  }
  TArray<unsigned_char_*,_unsigned_char_*>::Clear(&this->BuildTileFiles);
  return;
}

Assistant:

void FTextureManager::DeleteAll()
{
	for (unsigned int i = 0; i < Textures.Size(); ++i)
	{
		delete Textures[i].Texture;
	}
	Textures.Clear();
	Translation.Clear();
	FirstTextureForFile.Clear();
	memset (HashFirst, -1, sizeof(HashFirst));
	DefaultTexture.SetInvalid();

	for (unsigned i = 0; i < mAnimations.Size(); i++)
	{
		if (mAnimations[i] != NULL)
		{
			M_Free (mAnimations[i]);
			mAnimations[i] = NULL;
		}
	}
	mAnimations.Clear();

	for (unsigned i = 0; i < mSwitchDefs.Size(); i++)
	{
		if (mSwitchDefs[i] != NULL)
		{
			M_Free (mSwitchDefs[i]);
			mSwitchDefs[i] = NULL;
		}
	}
	mSwitchDefs.Clear();

	for (unsigned i = 0; i < mAnimatedDoors.Size(); i++)
	{
		if (mAnimatedDoors[i].TextureFrames != NULL)
		{
			delete[] mAnimatedDoors[i].TextureFrames;
			mAnimatedDoors[i].TextureFrames = NULL;
		}
	}
	mAnimatedDoors.Clear();

	for (unsigned int i = 0; i < BuildTileFiles.Size(); ++i)
	{
		delete[] BuildTileFiles[i];
	}
	BuildTileFiles.Clear();
}